

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

uintptr_t upb_Arena_SpaceAllocated(upb_Arena *arena,size_t *fused_count)

{
  uintptr_t uVar1;
  size_t sVar2;
  upb_Arena *puVar3;
  upb_Arena *puVar4;
  
  puVar3 = (upb_Arena *)arena[3].ptr_dont_copy_me__upb_internal_use_only;
  puVar4 = arena + 1;
  uVar1 = 0;
  sVar2 = 0;
  while( true ) {
    if (((ulong)puVar3 & 1) != 0) {
      do {
        uVar1 = uVar1 + (long)puVar4[3].ptr_dont_copy_me__upb_internal_use_only;
        puVar4 = (upb_Arena *)puVar4[1].end_dont_copy_me__upb_internal_use_only;
        sVar2 = sVar2 + 1;
      } while (puVar4 != (upb_Arena *)0x0);
      if (fused_count != (size_t *)0x0) {
        *fused_count = sVar2;
      }
      return uVar1;
    }
    if (puVar4 == puVar3) break;
    uVar1 = uVar1 + (long)puVar3[3].ptr_dont_copy_me__upb_internal_use_only;
    puVar3 = (upb_Arena *)puVar3[2].ptr_dont_copy_me__upb_internal_use_only;
    sVar2 = sVar2 + 1;
  }
  __assert_fail("previous != ai",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                ,0x106,"uintptr_t upb_Arena_SpaceAllocated(const upb_Arena *, size_t *)");
}

Assistant:

uintptr_t upb_Arena_SpaceAllocated(const upb_Arena* arena,
                                   size_t* fused_count) {
  upb_ArenaInternal* ai = upb_Arena_Internal(arena);
  uintptr_t memsize = 0;
  size_t local_fused_count = 0;
  // Our root would get updated by any racing fuses before our target arena
  // became reachable from the root via the linked list; in order to preserve
  // monotonic output (any arena counted by a previous invocation is counted by
  // this one), we instead iterate forwards and backwards so that we only see
  // the results of completed fuses.
  uintptr_t previous_or_tail =
      upb_Atomic_Load(&ai->previous_or_tail, memory_order_acquire);
  while (_upb_Arena_IsTaggedPrevious(previous_or_tail)) {
    upb_ArenaInternal* previous =
        _upb_Arena_PreviousFromTagged(previous_or_tail);
    UPB_ASSERT(previous != ai);
    UPB_TSAN_CHECK_PUBLISHED(previous);
    // Unfortunate macro behavior; prior to C11 when using nonstandard atomics
    // this returns a void* and can't be used with += without an intermediate
    // conversion to an integer.
    // Relaxed is safe - no subsequent reads depend this one
    uintptr_t allocated =
        upb_Atomic_Load(&previous->space_allocated, memory_order_relaxed);
    memsize += allocated;
    previous_or_tail =
        upb_Atomic_Load(&previous->previous_or_tail, memory_order_acquire);
    local_fused_count++;
  }
  while (ai != NULL) {
    UPB_TSAN_CHECK_PUBLISHED(ai);
    // Unfortunate macro behavior; prior to C11 when using nonstandard atomics
    // this returns a void* and can't be used with += without an intermediate
    // conversion to an integer.
    // Relaxed is safe - no subsequent reads depend this one
    uintptr_t allocated =
        upb_Atomic_Load(&ai->space_allocated, memory_order_relaxed);
    memsize += allocated;
    ai = upb_Atomic_Load(&ai->next, memory_order_acquire);
    local_fused_count++;
  }

  if (fused_count) *fused_count = local_fused_count;
  return memsize;
}